

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  undefined1 *puVar1;
  int iVar2;
  code *pcVar3;
  secp256k1_scalar *ng;
  secp256k1_scalar *psVar4;
  size_t sVar5;
  secp256k1_gej *r_00;
  ulong uVar6;
  secp256k1_strauss_point_state *scratch_00;
  secp256k1_strauss_point_state *elem;
  code *cb;
  secp256k1_scalar *cbdata;
  secp256k1_callback *error_callback;
  long lVar7;
  secp256k1_strauss_point_state *r_01;
  secp256k1_strauss_point_state *psVar8;
  size_t size;
  secp256k1_ge r;
  secp256k1_gej rj6;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_gej rj5;
  uchar bytes [65];
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj4;
  ulong uStack_1440;
  secp256k1_strauss_state sStack_1428;
  secp256k1_fe asStack_1410 [8];
  secp256k1_strauss_point_state sStack_12d0;
  secp256k1_ge asStack_ec0 [8];
  secp256k1_scratch *psStack_bf8;
  secp256k1_callback *psStack_bf0;
  secp256k1_gej *psStack_be8;
  secp256k1_strauss_point_state *psStack_be0;
  secp256k1_strauss_point_state *psStack_bd8;
  secp256k1_strauss_point_state *psStack_bd0;
  secp256k1_strauss_point_state *psStack_bc0;
  undefined1 local_ba8 [8];
  undefined1 local_ba0 [88];
  secp256k1_gej local_b48;
  secp256k1_gej local_ac8;
  secp256k1_gej local_a48;
  secp256k1_gej local_9c8;
  secp256k1_gej local_948 [2];
  secp256k1_strauss_point_state local_808;
  secp256k1_gej local_3f8;
  secp256k1_gej local_378;
  
  local_ba8 = (undefined1  [8])0x41;
  local_378.infinity = 0;
  local_378.x.n[0] = 0x2815b16f81798;
  local_378.x.n[1] = 0xdb2dce28d959f;
  local_378.x.n[2] = 0xe870b07029bfc;
  local_378.x.n[3] = 0xbbac55a06295c;
  local_378.x.n[4] = 0x79be667ef9dc;
  local_378.y.n[4] = 0x483ada7726a3;
  local_378.y.n[0] = 0x7d08ffb10d4b8;
  local_378.y.n[1] = 0x48a68554199c4;
  local_378.y.n[2] = 0xe1108a8fd17b4;
  local_378.y.n[3] = 0xc4655da4fbfc0;
  local_378.z.n[0] = 1;
  local_378.z.n[1] = 0;
  local_378.z.n[2] = 0;
  local_378.z.n[3] = 0;
  local_378.z.n[4] = 0;
  local_3f8.infinity = 1;
  local_3f8.z.n[4] = 0;
  local_3f8.z.n[2] = 0;
  local_3f8.z.n[3] = 0;
  local_3f8.z.n[0] = 0;
  local_3f8.z.n[1] = 0;
  local_3f8.y.n[3] = 0;
  local_3f8.y.n[4] = 0;
  local_3f8.y.n[1] = 0;
  local_3f8.y.n[2] = 0;
  local_3f8.x.n[4] = 0;
  local_3f8.y.n[0] = 0;
  local_3f8.x.n[2] = 0;
  local_3f8.x.n[3] = 0;
  local_3f8.x.n[0] = 0;
  local_3f8.x.n[1] = 0;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x16aebe;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_9c8,x);
  r_01 = (secp256k1_strauss_point_state *)&stack0xfffffffffffffd08;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x16af0b;
  local_ac8.x.n[0] = (uint64_t)local_948;
  local_ac8.x.n[1] = (uint64_t)r_01;
  local_ac8.x.n[2] = (uint64_t)&local_808;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_ac8,&local_a48,1,&local_378,x,&secp256k1_scalar_zero)
  ;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x16af3e;
  local_b48.x.n[0] = (uint64_t)local_948;
  local_b48.x.n[1] = (uint64_t)r_01;
  local_b48.x.n[2] = (uint64_t)&local_808;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_b48,&local_ac8,1,&local_3f8,&secp256k1_scalar_zero,x)
  ;
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_scalar *)0x0;
  psStack_bd0 = (secp256k1_strauss_point_state *)0x16af6d;
  ng = x;
  scratch_00 = (secp256k1_strauss_point_state *)scratch;
  iVar2 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,scratch,(secp256k1_gej *)&stack0xfffffffffffffd08,x,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar2 == 0) {
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b14a;
    test_ecmult_accumulate_cold_8();
LAB_0016b14a:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b14f;
    test_ecmult_accumulate_cold_7();
LAB_0016b14f:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b154;
    test_ecmult_accumulate_cold_6();
LAB_0016b154:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b159;
    test_ecmult_accumulate_cold_5();
LAB_0016b159:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b15e;
    test_ecmult_accumulate_cold_4();
LAB_0016b15e:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b163;
    test_ecmult_accumulate_cold_3();
LAB_0016b163:
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b168;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    ng = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16afa8;
    scratch_00 = (secp256k1_strauss_point_state *)scratch;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = x;
    iVar2 = secp256k1_ecmult_multi_var
                      (error_callback,scratch,local_948,&secp256k1_scalar_zero,
                       test_ecmult_accumulate_cb,x,1);
    if (iVar2 == 0) goto LAB_0016b14a;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16afc7;
    secp256k1_ecmult_const(&local_b48,&secp256k1_ge_const_g,x);
    x = (secp256k1_scalar *)local_ba0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16afdc;
    secp256k1_ge_set_gej_var((secp256k1_ge *)x,&local_9c8);
    r_01 = &local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16aff4;
    secp256k1_gej_neg((secp256k1_gej *)r_01,&local_a48);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b004;
    scratch_00 = r_01;
    elem = r_01;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_01,(secp256k1_gej *)r_01,(secp256k1_ge *)x,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_0016b14f;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b027;
    secp256k1_gej_neg((secp256k1_gej *)x,&local_ac8);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b039;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_0016b154;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b05c;
    secp256k1_gej_neg((secp256k1_gej *)x,(secp256k1_gej *)&stack0xfffffffffffffd08);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b06e;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_0016b159;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b091;
    secp256k1_gej_neg((secp256k1_gej *)x,local_948);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b0a3;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_0016b15e;
    x = (secp256k1_scalar *)&local_808;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b0c6;
    secp256k1_gej_neg((secp256k1_gej *)x,&local_b48);
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b0d8;
    scratch_00 = (secp256k1_strauss_point_state *)x;
    elem = (secp256k1_strauss_point_state *)x;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)x,(secp256k1_gej *)x,(secp256k1_ge *)local_ba0,(secp256k1_fe *)0x0);
    if (local_808.wnaf_na_1[0x1e] == 0) goto LAB_0016b163;
    if (local_ba0._80_4_ != 0) {
      local_808.wnaf_na_1[0]._0_1_ = 0;
      sVar5 = 1;
LAB_0016b129:
      psStack_bd0 = (secp256k1_strauss_point_state *)0x16b133;
      secp256k1_sha256_write(acc,(uchar *)&local_808,sVar5);
      return;
    }
    elem = (secp256k1_strauss_point_state *)local_ba0;
    scratch_00 = &local_808;
    x = (secp256k1_scalar *)local_ba8;
    ng = (secp256k1_scalar *)0x0;
    psStack_bd0 = (secp256k1_strauss_point_state *)0x16b118;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_00,(size_t *)x,0);
    if (local_ba8 == (undefined1  [8])0x41) {
      sVar5 = 0x41;
      goto LAB_0016b129;
    }
  }
  psStack_bd0 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r_00->infinity = 1;
  (r_00->x).n[0] = 0;
  (r_00->x).n[1] = 0;
  (r_00->x).n[2] = 0;
  (r_00->x).n[3] = 0;
  (r_00->x).n[4] = 0;
  (r_00->y).n[0] = 0;
  (r_00->y).n[1] = 0;
  (r_00->y).n[2] = 0;
  (r_00->y).n[3] = 0;
  (r_00->y).n[4] = 0;
  (r_00->z).n[0] = 0;
  (r_00->z).n[1] = 0;
  (r_00->z).n[2] = 0;
  (r_00->z).n[3] = 0;
  (r_00->z).n[4] = 0;
  if (ng != (secp256k1_scalar *)0x0 || psStack_bc0 != (secp256k1_strauss_point_state *)0x0) {
    psStack_bf8 = scratch;
    psStack_bf0 = error_callback;
    psStack_be8 = &local_3f8;
    psStack_be0 = (secp256k1_strauss_point_state *)x;
    psStack_bd8 = r_01;
    psStack_bd0 = &local_808;
    if (psStack_bc0 != (secp256k1_strauss_point_state *)0x0) {
      if (scratch_00 != (secp256k1_strauss_point_state *)0x0) {
        sVar5 = secp256k1_pippenger_max_points
                          ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00);
        if (sVar5 != 0) {
          uVar6 = 5000000;
          if (sVar5 < 5000000) {
            uVar6 = sVar5;
          }
          puVar1 = (undefined1 *)((long)psStack_bc0[-1].wnaf_na_lam + 0x20b);
          uStack_1440 = (ulong)puVar1 / uVar6 + 1;
          r_01 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_1440 + 1);
        }
        if (sVar5 != 0) {
          if (r_01 < (secp256k1_strauss_point_state *)0x58) {
            sVar5 = secp256k1_scratch_max_allocation
                              ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00,5);
            if (0x8af < sVar5) {
              uVar6 = sVar5 / 0x8b0;
              if (4999999 < uVar6) {
                uVar6 = 5000000;
              }
              puVar1 = (undefined1 *)((long)psStack_bc0[-1].wnaf_na_lam + 0x20b);
              uStack_1440 = (ulong)puVar1 / uVar6 + 1;
              r_01 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_1440 + 1);
            }
            if (sVar5 < 0x8b0) goto LAB_0016b325;
            pcVar3 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar3 = secp256k1_ecmult_pippenger_batch;
          }
          lVar7 = 0;
          uVar6 = 0;
          while( true ) {
            psVar8 = r_01;
            if (psStack_bc0 < r_01) {
              psVar8 = psStack_bc0;
            }
            psVar4 = (secp256k1_scalar *)0x0;
            if (uVar6 == 0) {
              psVar4 = ng;
            }
            iVar2 = (*pcVar3)(elem,scratch_00,&sStack_12d0,psVar4,cb,cbdata,psVar8,lVar7);
            if (iVar2 == 0) break;
            secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_12d0,(secp256k1_fe *)0x0);
            psStack_bc0 = (secp256k1_strauss_point_state *)((long)psStack_bc0 - (long)psVar8);
            uVar6 = uVar6 + 1;
            lVar7 = (long)((secp256k1_fe *)r_01->wnaf_na_1)->n + lVar7;
            if (uStack_1440 == uVar6) {
              return;
            }
          }
          return;
        }
      }
LAB_0016b325:
      secp256k1_ecmult_multi_simple_var(r_00,ng,cb,cbdata,(size_t)psStack_bc0);
      return;
    }
    sStack_1428.aux = asStack_1410;
    sStack_1428.pre_a = asStack_ec0;
    sStack_1428.ps = &sStack_12d0;
    secp256k1_ecmult_strauss_wnaf(&sStack_1428,r_00,1,r_00,&secp256k1_scalar_zero,ng);
  }
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &secp256k1_scalar_zero);
    secp256k1_ecmult(&rj3, &infj, &secp256k1_scalar_zero, x);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0));
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1));
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    CHECK(secp256k1_gej_eq_ge_var(&rj2, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj3, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj4, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj5, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj6, &r));
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}